

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.cc
# Opt level: O2

Optional<webrtc::CartesianPoint<float>_>
webrtc::GetDirectionIfLinear
          (vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
           *array_geometry)

{
  Point *a;
  pointer pCVar1;
  bool bVar2;
  string *result;
  ulong uVar3;
  Point *a_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Point PVar4;
  Point PVar5;
  Optional<webrtc::CartesianPoint<float>_> OVar6;
  Point local_1c8;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_1a8._0_8_ =
       ((long)(array_geometry->
              super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
       (long)(array_geometry->
             super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
             )._M_impl.super__Vector_impl_data._M_start) / 0xc;
  local_1c8.c[0] = 1.4013e-45;
  result = rtc::CheckGTImpl<unsigned_long,unsigned_int>
                     ((unsigned_long *)local_1a8,(uint *)&local_1c8,"array_geometry.size() > 1u");
  if (result != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              ((FatalMessage *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/array_util.cc"
               ,0x3d,result);
    rtc::FatalMessage::~FatalMessage((FatalMessage *)local_1a8);
  }
  a = (array_geometry->
      super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
      )._M_impl.super__Vector_impl_data._M_start;
  PVar4 = PairDirection(a,a + 1);
  local_1a8._0_8_ = PVar4.c._0_8_;
  local_1b8._8_4_ = extraout_XMM0_Dc;
  local_1b8._0_8_ = local_1a8._0_8_;
  local_1b8._12_4_ = extraout_XMM0_Dd;
  pCVar1 = (array_geometry->
           super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = 1;
  a_00 = a + 1;
  local_1a8._8_4_ = PVar4.c[2];
  do {
    uVar3 = uVar3 + 1;
    if ((ulong)(((long)pCVar1 - (long)a) / 0xc) <= uVar3) {
      uVar3 = (ulong)(uint)PVar4.c[2] | 0x100000000;
      goto LAB_0017837e;
    }
    PVar5 = PairDirection(a_00,a_00 + 1);
    local_1c8.c[2] = PVar5.c[2];
    local_1c8.c._0_8_ = PVar5.c._0_8_;
    bVar2 = AreParallel((Point *)local_1a8,&local_1c8);
    a_00 = a_00 + 1;
  } while (bVar2);
  local_1b8._0_4_ = 0;
  local_1b8._4_4_ = 0;
  uVar3 = 0;
LAB_0017837e:
  OVar6.value_.c[1] = (float)local_1b8._4_4_;
  OVar6.value_.c[0] = (float)local_1b8._0_4_;
  OVar6.value_.c[2] = (float)(int)uVar3;
  OVar6.has_value_ = (bool)(char)(uVar3 >> 0x20);
  OVar6._13_3_ = (int3)(uVar3 >> 0x28);
  return OVar6;
}

Assistant:

rtc::Optional<Point> GetDirectionIfLinear(
    const std::vector<Point>& array_geometry) {
  RTC_DCHECK_GT(array_geometry.size(), 1u);
  const Point first_pair_direction =
      PairDirection(array_geometry[0], array_geometry[1]);
  for (size_t i = 2u; i < array_geometry.size(); ++i) {
    const Point pair_direction =
        PairDirection(array_geometry[i - 1], array_geometry[i]);
    if (!AreParallel(first_pair_direction, pair_direction)) {
      return rtc::Optional<Point>();
    }
  }
  return rtc::Optional<Point>(first_pair_direction);
}